

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_abstract::~cse_abstract(cse_abstract *this)

{
  code *pcVar1;
  cse_abstract *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

cse_abstract::~cse_abstract() {}